

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O2

EdgeIdx __thiscall Escape::CGraph::getEdgeCount(CGraph *this,VertexIdx v1,VertexIdx v2)

{
  VertexIdx *pVVar1;
  EdgeIdx EVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  
  if (v1 < this->nVertices) {
    pVVar1 = this->nbors;
    lVar6 = this->offsets[v1 + 1] + -1;
    EVar2 = this->offsets[v1];
    while (lVar7 = EVar2, lVar7 <= lVar6) {
      lVar3 = (lVar6 + lVar7) / 2;
      if (pVVar1[lVar3] == v2) {
        lVar4 = 1;
        lVar5 = lVar3;
        while ((lVar5 < lVar6 && (lVar5 = lVar5 + 1, pVVar1[lVar5] == v2))) {
          lVar4 = lVar4 + 1;
        }
        lVar6 = 0;
        while ((lVar7 < lVar3 + lVar6 && (pVVar1[lVar3 + lVar6 + -1] == v2))) {
          lVar6 = lVar6 + -1;
        }
        return lVar4 - lVar6;
      }
      EVar2 = lVar3 + 1;
      if (v2 < pVVar1[lVar3]) {
        lVar6 = lVar3 + -1;
        EVar2 = lVar7;
      }
    }
  }
  return -1;
}

Assistant:

EdgeIdx CGraph::getEdgeCount(VertexIdx v1, VertexIdx v2) const {
    if (v1 >= nVertices)
        return -1;
    EdgeIdx low = offsets[v1];
    EdgeIdx high = offsets[v1 + 1] - 1;
    EdgeIdx mid;
    EdgeIdx found, multiplicity=0;

    while (low <= high) {
        mid = (low + high) / 2;
        if (nbors[mid] == v2) {
            multiplicity = 1;
            found = mid+1;
            while ( found <= high && nbors[found] == v2) {
                multiplicity++;
                found ++;
            }
            found = mid-1;
            while ( found >= low && nbors[found] == v2) {
                multiplicity ++;
                found --;
            }
            return multiplicity;
        }
        if (nbors[mid] > v2)
            high = mid - 1;
        else
            low = mid + 1;
    }
    return -1;
}